

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::internal_lower_bound<int>
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,int *key)

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar1;
  SearchResult<int,_false> SVar2;
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *this_00;
  ulong uVar3;
  iterator iVar4;
  
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             *)(this->root_).
               super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>
               .
               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_false>
               ._M_head_impl;
  SVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
          linear_search<int,phmap::Less<int>>(this_00,key,(Less<int> *)this);
  while (((ulong)this_00 & 7) == 0) {
    uVar3 = (ulong)(uint)SVar2.value;
    if (((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *)this_00)[0xb] !=
        (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
         )0x0) goto LAB_001df9ae;
    this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               *)btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 ::child((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                          *)this_00,(long)SVar2.value);
    SVar2 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
            ::linear_search<int,phmap::Less<int>>(this_00,key,(Less<int> *)this);
  }
LAB_001df97b:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
LAB_001df9ae:
  if (((ulong)this_00 & 7) != 0) goto LAB_001df97b;
  if ((uint)uVar3 !=
      (uint)(byte)((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                    *)this_00)[10]) goto LAB_001df9bf;
  pbVar1 = *(btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
             **)this_00;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_001df97b;
  uVar3 = (ulong)(byte)((btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                         *)this_00)[8];
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             *)pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>)
      0x0) {
    this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               *)0x0;
LAB_001df9bf:
    iVar4._8_8_ = uVar3;
    iVar4.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                  *)this_00;
    return iVar4;
  }
  goto LAB_001df9ae;
}

Assistant:

auto btree<P>::internal_lower_bound(const K &key) const -> iterator {
        iterator iter(const_cast<node_type *>(root()), 0);
        for (;;) {
            iter.position = iter.node->lower_bound(key, key_comp()).value;
            if (iter.node->leaf()) {
                break;
            }
            iter.node = iter.node->child(iter.position);
        }
        return internal_last(iter);
    }